

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool bitset_container_is_subset_run(bitset_container_t *container1,run_container_t *container2)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  uint64_t uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  bool bVar9;
  bool bVar10;
  
  iVar4 = container1->cardinality;
  if ((iVar4 != -1) && (iVar2 = run_container_cardinality(container2), iVar2 < iVar4)) {
    return false;
  }
  uVar3 = 0;
  iVar4 = 0;
  do {
    if (uVar3 == 0x400) {
      return true;
    }
    if (container2->n_runs <= iVar4) {
      do {
        bVar10 = container1->words[uVar3] == 0;
        if (!bVar10) {
          return bVar10;
        }
        bVar9 = uVar3 < 0x3ff;
        uVar3 = uVar3 + 1;
      } while (bVar9);
      return bVar10;
    }
    for (uVar5 = container1->words[uVar3]; uVar5 != 0; uVar5 = uVar5 & uVar8) {
      if (container2->n_runs <= iVar4) {
        return false;
      }
      lVar1 = 0;
      if (uVar5 != 0) {
        for (; (uVar5 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
        }
      }
      uVar6 = (uint)lVar1 | (int)uVar3 << 6;
      uVar7 = (uint)container2->runs[iVar4].value;
      if (uVar6 < uVar7) {
        return false;
      }
      uVar7 = container2->runs[iVar4].length + uVar7;
      uVar8 = uVar5 - 1;
      if (uVar7 < uVar6) {
        uVar8 = 0xffffffffffffffff;
      }
      iVar4 = iVar4 + (uint)(uVar7 < uVar6);
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

bool bitset_container_is_subset_run(const bitset_container_t* container1,
                                    const run_container_t* container2) {
    // todo: this code could be much faster
    if (container1->cardinality != BITSET_UNKNOWN_CARDINALITY) {
        if (container1->cardinality > run_container_cardinality(container2)) {
            return false;
        }
    }
    int32_t i_bitset = 0, i_run = 0;
    while (i_bitset < BITSET_CONTAINER_SIZE_IN_WORDS &&
           i_run < container2->n_runs) {
        uint64_t w = container1->words[i_bitset];
        while (w != 0 && i_run < container2->n_runs) {
            uint32_t start = container2->runs[i_run].value;
            uint32_t stop = start + container2->runs[i_run].length;
            uint64_t t = w & (~w + 1);
            uint16_t r = i_bitset * 64 + __builtin_ctzll(w);
            if (r < start) {
                return false;
            } else if (r > stop) {
                i_run++;
                continue;
            } else {
                w ^= t;
            }
        }
        if (w == 0) {
            i_bitset++;
        } else {
            return false;
        }
    }
    if (i_bitset < BITSET_CONTAINER_SIZE_IN_WORDS) {
        // terminated iterating on the run containers, check that rest of bitset
        // is empty
        for (; i_bitset < BITSET_CONTAINER_SIZE_IN_WORDS; i_bitset++) {
            if (container1->words[i_bitset] != 0) {
                return false;
            }
        }
    }
    return true;
}